

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

int htmlSkipBlankChars(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  int iVar2;
  xmlParserInputPtr pxVar3;
  xmlChar *pxVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  pxVar3 = ctxt->input;
  pxVar4 = pxVar3->cur;
  iVar6 = pxVar3->line;
  iVar7 = pxVar3->col;
  if (ctxt->disableSAX < 2) {
    lVar5 = (long)pxVar3->end - (long)pxVar4;
    iVar8 = 0;
    do {
      if (lVar5 == 0) {
        pxVar3->cur = pxVar4;
        if (((pxVar3->flags & 0x40) == 0) && ((long)pxVar3->end - (long)pxVar4 < 0xfa)) {
          xmlParserGrow(ctxt);
          pxVar3 = ctxt->input;
        }
        pxVar4 = pxVar3->cur;
        lVar5 = (long)pxVar3->end - (long)pxVar4;
        if (lVar5 == 0) break;
      }
      xVar1 = *pxVar4;
      if (xVar1 == ' ') {
LAB_00167968:
        iVar7 = iVar7 + 1;
      }
      else {
        if (xVar1 != '\n') {
          if ((xVar1 != '\v') && (0xfa < (byte)(xVar1 - 0xe))) goto LAB_00167968;
          break;
        }
        iVar6 = iVar6 + 1;
        iVar7 = 1;
      }
      pxVar4 = pxVar4 + 1;
      lVar5 = lVar5 + -1;
      iVar2 = iVar8 + 1;
      if (iVar8 == 0x7fffffff) {
        iVar2 = iVar8;
      }
      iVar8 = iVar2;
    } while (ctxt->disableSAX < 2);
    pxVar3->cur = pxVar4;
    pxVar3->line = iVar6;
    pxVar3->col = iVar7;
    if (((8 < iVar8) && ((pxVar3->flags & 0x40) == 0)) &&
       (pxVar3 = (xmlParserInputPtr)(pxVar3->end + -(long)pxVar4), (long)pxVar3 < 0xfa)) {
      iVar6 = xmlParserGrow(ctxt);
      return iVar6;
    }
  }
  else {
    pxVar3->cur = pxVar4;
    pxVar3->line = iVar6;
    pxVar3->col = iVar7;
  }
  return (int)pxVar3;
}

Assistant:

static int
htmlSkipBlankChars(xmlParserCtxtPtr ctxt) {
    const xmlChar *cur = ctxt->input->cur;
    size_t avail = ctxt->input->end - cur;
    int res = 0;
    int line = ctxt->input->line;
    int col = ctxt->input->col;

    while (!PARSER_STOPPED(ctxt)) {
        if (avail == 0) {
            ctxt->input->cur = cur;
            GROW;
            cur = ctxt->input->cur;
            avail = ctxt->input->end - cur;

            if (avail == 0)
                break;
        }

        if (*cur == '\n') {
            line++;
            col = 1;
        } else if (IS_WS_HTML(*cur)) {
            col++;
        } else {
            break;
        }

        cur += 1;
        avail -= 1;

	if (res < INT_MAX)
	    res++;
    }

    ctxt->input->cur = cur;
    ctxt->input->line = line;
    ctxt->input->col = col;

    if (res > 8)
        GROW;

    return(res);
}